

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::print<char*,char[23]>(ConsoleLogger *this,char **t,char (*args) [23])

{
  ostream *poVar1;
  undefined8 *in_RSI;
  ConsoleLogger *in_RDI;
  char (*in_stack_ffffffffffffffd8) [23];
  
  poVar1 = std::operator<<(in_RDI->out,(char *)*in_RSI);
  std::operator<<(poVar1," ");
  print<char[23]>(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t, const Args&... args)
{
	out << t << " ";
	print(args...);
}